

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O3

REF_STATUS ref_agents_restart(REF_AGENTS ref_agents,REF_INT part,REF_INT seed,REF_INT id)

{
  REF_AGENT_STRUCT *pRVar1;
  
  pRVar1 = ref_agents->agent;
  pRVar1[id].mode = REF_AGENT_WALKING;
  pRVar1[id].part = part;
  pRVar1[id].seed = seed;
  pRVar1[id].global = -1;
  pRVar1[id].step = 0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_agents_restart(REF_AGENTS ref_agents, REF_INT part,
                                      REF_INT seed, REF_INT id) {
  ref_agent_mode(ref_agents, id) = REF_AGENT_WALKING;
  ref_agent_part(ref_agents, id) = part;
  ref_agent_seed(ref_agents, id) = seed;
  ref_agent_global(ref_agents, id) = REF_EMPTY;
  ref_agent_step(ref_agents, id) = 0;

  return REF_SUCCESS;
}